

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

string * __thiscall
notch::core::LogisticActivation::tag_abi_cxx11_
          (string *__return_storage_ptr__,LogisticActivation *this)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"logistic",8);
  if ((this->slope != 1.0) || (NAN(this->slope))) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(",1);
    poVar1 = ::std::ostream::_M_insert<double>((double)this->slope);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string tag() const {
        std::ostringstream out;
        out << "logistic";
        if (slope != 1.0) {
            out << "(" << slope << ")";
        }
        return out.str();
    }